

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_enc.c
# Opt level: O1

int VP8RecordCoeffTokens(int ctx,VP8Residual *res,VP8TBuffer *tokens)

{
  long lVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  int16_t *piVar5;
  StatsArray *paapVar6;
  bool bVar7;
  short sVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ushort uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  proba_t (*papVar17) [11];
  ushort uVar18;
  long lVar19;
  uint16_t uVar20;
  int iVar21;
  uint8_t *puVar22;
  
  piVar5 = res->coeffs;
  iVar10 = res->coeff_type;
  uVar4 = res->last;
  iVar11 = res->first;
  iVar21 = ((iVar11 + iVar10 * 8) * 3 + ctx) * 0xb;
  papVar17 = res->stats[iVar11] + ctx;
  if ((0 < tokens->left) || (iVar9 = TBufferNewPage(tokens), iVar9 != 0)) {
    iVar9 = tokens->left;
    tokens->left = iVar9 + -1;
    tokens->tokens[(long)iVar9 + -1] = ~(ushort)(uVar4 >> 0x10) & 0x8000 | (ushort)iVar21;
  }
  uVar12 = (*papVar17)[0];
  uVar14 = uVar12 + 1 >> 1 & 0x7fff7fff;
  if (uVar12 < 0xfffe0000) {
    uVar14 = uVar12;
  }
  (*papVar17)[0] = (uVar4 >> 0x1f ^ 0x10001) + uVar14;
  if ((int)uVar4 < 0) {
    iVar9 = 0;
  }
  else {
    iVar9 = 1;
    if (iVar11 < 0x10) {
      iVar10 = iVar10 * 8;
      lVar16 = (long)iVar11;
      do {
        uVar3 = piVar5[lVar16];
        uVar18 = -uVar3;
        if (0 < (short)uVar3) {
          uVar18 = uVar3;
        }
        sVar8 = (short)iVar21;
        if ((0 < tokens->left) || (iVar11 = TBufferNewPage(tokens), iVar11 != 0)) {
          iVar11 = tokens->left;
          tokens->left = iVar11 + -1;
          tokens->tokens[(long)iVar11 + -1] = (ushort)(uVar3 != 0) << 0xf | sVar8 + 1U;
        }
        lVar1 = lVar16 + 1;
        uVar12 = (*papVar17)[1];
        uVar14 = uVar12 + 1 >> 1 & 0x7fff7fff;
        if (uVar12 < 0xfffe0000) {
          uVar14 = uVar12;
        }
        (*papVar17)[1] = (uVar3 == 0 ^ 0x10001) + uVar14;
        if (uVar3 == 0) {
          bVar2 = ""[lVar16 + 1];
          iVar21 = (iVar10 + (uint)bVar2) * 0x21;
          papVar17 = (proba_t (*) [11])((long)*res->stats + (ulong)bVar2 * 0x80 + (ulong)bVar2 * 4);
          uVar12 = 0;
        }
        else {
          if ((0 < tokens->left) || (iVar11 = TBufferNewPage(tokens), iVar11 != 0)) {
            iVar11 = tokens->left;
            tokens->left = iVar11 + -1;
            tokens->tokens[(long)iVar11 + -1] = (ushort)(1 < uVar18) << 0xf | sVar8 + 2U;
          }
          uVar12 = (*papVar17)[2];
          uVar14 = uVar12 + 1 >> 1 & 0x7fff7fff;
          if (uVar12 < 0xfffe0000) {
            uVar14 = uVar12;
          }
          (*papVar17)[2] = (0x10001 - (uint)(uVar18 < 2)) + uVar14;
          if (uVar18 < 2) {
            lVar19 = 1;
            iVar21 = 0xb;
          }
          else {
            if ((0 < tokens->left) || (iVar11 = TBufferNewPage(tokens), iVar11 != 0)) {
              iVar11 = tokens->left;
              tokens->left = iVar11 + -1;
              tokens->tokens[(long)iVar11 + -1] = (ushort)(4 < uVar18) << 0xf | sVar8 + 3U;
            }
            uVar12 = (*papVar17)[3];
            uVar14 = uVar12 + 1 >> 1 & 0x7fff7fff;
            if (uVar12 < 0xfffe0000) {
              uVar14 = uVar12;
            }
            (*papVar17)[3] = (0x10001 - (uint)(uVar18 < 5)) + uVar14;
            if (uVar18 < 5) {
              if ((0 < tokens->left) || (iVar11 = TBufferNewPage(tokens), iVar11 != 0)) {
                iVar11 = tokens->left;
                tokens->left = iVar11 + -1;
                tokens->tokens[(long)iVar11 + -1] = (ushort)(uVar18 != 2) << 0xf | sVar8 + 4U;
              }
              uVar12 = (*papVar17)[4];
              uVar14 = uVar12 + 1 >> 1 & 0x7fff7fff;
              if (uVar12 < 0xfffe0000) {
                uVar14 = uVar12;
              }
              (*papVar17)[4] = (uVar18 == 2 ^ 0x10001) + uVar14;
              lVar19 = 2;
              iVar21 = 0x16;
              if (uVar18 != 2) {
                if ((0 < tokens->left) || (iVar11 = TBufferNewPage(tokens), iVar11 != 0)) {
                  iVar11 = tokens->left;
                  tokens->left = iVar11 + -1;
                  tokens->tokens[(long)iVar11 + -1] = (ushort)(uVar18 == 4) << 0xf | sVar8 + 5U;
                }
                uVar12 = (*papVar17)[5];
                uVar14 = uVar12 + 1 >> 1 & 0x7fff7fff;
                if (uVar12 < 0xfffe0000) {
                  uVar14 = uVar12;
                }
                (*papVar17)[5] = (uVar18 == 4) + uVar14 + 0x10000;
              }
            }
            else {
              if ((0 < tokens->left) || (iVar11 = TBufferNewPage(tokens), iVar11 != 0)) {
                iVar11 = tokens->left;
                tokens->left = iVar11 + -1;
                tokens->tokens[(long)iVar11 + -1] = (ushort)(10 < uVar18) << 0xf | sVar8 + 6U;
              }
              uVar12 = (*papVar17)[6];
              uVar14 = uVar12 + 1 >> 1 & 0x7fff7fff;
              if (uVar12 < 0xfffe0000) {
                uVar14 = uVar12;
              }
              (*papVar17)[6] = (0x10001 - (uint)(uVar18 < 0xb)) + uVar14;
              if (uVar18 < 0xb) {
                if ((0 < tokens->left) || (iVar11 = TBufferNewPage(tokens), iVar11 != 0)) {
                  iVar11 = tokens->left;
                  tokens->left = iVar11 + -1;
                  tokens->tokens[(long)iVar11 + -1] = (ushort)(6 < uVar18) << 0xf | sVar8 + 7U;
                }
                uVar12 = (*papVar17)[7];
                uVar14 = uVar12 + 1 >> 1 & 0x7fff7fff;
                if (uVar12 < 0xfffe0000) {
                  uVar14 = uVar12;
                }
                (*papVar17)[7] = (0x10001 - (uint)(uVar18 < 7)) + uVar14;
                if (uVar18 < 7) {
                  if ((0 < tokens->left) || (iVar11 = TBufferNewPage(tokens), iVar11 != 0)) {
                    iVar11 = tokens->left;
                    tokens->left = iVar11 + -1;
                    tokens->tokens[(long)iVar11 + -1] = (ushort)(uVar18 != 6) * -0x8000 + 0xc09f;
                  }
                }
                else {
                  if ((0 < tokens->left) || (iVar11 = TBufferNewPage(tokens), iVar11 != 0)) {
                    iVar11 = tokens->left;
                    tokens->left = iVar11 + -1;
                    tokens->tokens[(long)iVar11 + -1] = (ushort)(uVar18 < 9) * -0x8000 + 0xc0a5;
                  }
                  if ((0 < tokens->left) || (iVar11 = TBufferNewPage(tokens), iVar11 != 0)) {
                    iVar11 = tokens->left;
                    tokens->left = iVar11 + -1;
                    tokens->tokens[(long)iVar11 + -1] = uVar18 << 0xf ^ 0xc091;
                  }
                }
                lVar19 = 2;
                iVar21 = 0x16;
              }
              else {
                uVar12 = uVar18 - 3;
                if (uVar12 < 0x10) {
                  if ((0 < tokens->left) || (iVar11 = TBufferNewPage(tokens), iVar11 != 0)) {
                    iVar11 = tokens->left;
                    tokens->left = iVar11 + -1;
                    tokens->tokens[(long)iVar11 + -1] = sVar8 + 8;
                  }
                  uVar12 = (*papVar17)[8];
                  uVar14 = uVar12 + 1 >> 1 & 0x7fff7fff;
                  if (uVar12 < 0xfffe0000) {
                    uVar14 = uVar12;
                  }
                  (*papVar17)[8] = uVar14 + 0x10000;
                  if ((0 < tokens->left) || (iVar11 = TBufferNewPage(tokens), iVar11 != 0)) {
                    iVar9 = tokens->left + -1;
                    tokens->left = iVar9;
                    uVar20 = sVar8 + 9;
                    uVar12 = 4;
                    iVar21 = -0xb;
                    iVar11 = 0x10000;
                    puVar22 = VP8Cat3;
                    goto LAB_00139302;
                  }
                  uVar12 = 4;
                  iVar21 = -0xb;
                  iVar11 = 0x10000;
                  puVar22 = VP8Cat3;
                }
                else if (uVar12 < 0x20) {
                  if ((0 < tokens->left) || (iVar11 = TBufferNewPage(tokens), iVar11 != 0)) {
                    iVar11 = tokens->left;
                    tokens->left = iVar11 + -1;
                    tokens->tokens[(long)iVar11 + -1] = sVar8 + 8;
                  }
                  uVar12 = (*papVar17)[8];
                  uVar14 = uVar12 + 1 >> 1 & 0x7fff7fff;
                  if (uVar12 < 0xfffe0000) {
                    uVar14 = uVar12;
                  }
                  (*papVar17)[8] = uVar14 + 0x10000;
                  if ((0 < tokens->left) || (iVar11 = TBufferNewPage(tokens), iVar11 != 0)) {
                    iVar9 = tokens->left + -1;
                    tokens->left = iVar9;
                    uVar20 = sVar8 + 9U | 0x8000;
                    uVar12 = 8;
                    iVar21 = -0x13;
                    iVar11 = 0x10001;
                    puVar22 = VP8Cat4;
                    goto LAB_00139302;
                  }
                  uVar12 = 8;
                  iVar21 = -0x13;
                  iVar11 = 0x10001;
                  puVar22 = VP8Cat4;
                }
                else if (uVar12 < 0x40) {
                  if ((0 < tokens->left) || (iVar11 = TBufferNewPage(tokens), iVar11 != 0)) {
                    iVar11 = tokens->left;
                    tokens->left = iVar11 + -1;
                    tokens->tokens[(long)iVar11 + -1] = sVar8 + 8U | 0x8000;
                  }
                  uVar12 = (*papVar17)[8];
                  uVar14 = uVar12 + 1 >> 1 & 0x7fff7fff;
                  if (uVar12 < 0xfffe0000) {
                    uVar14 = uVar12;
                  }
                  (*papVar17)[8] = uVar14 + 0x10001;
                  if ((tokens->left < 1) && (iVar11 = TBufferNewPage(tokens), iVar11 == 0)) {
                    uVar12 = 0x10;
                    iVar21 = -0x23;
                    iVar11 = 0x10000;
                    puVar22 = VP8Cat5;
                  }
                  else {
                    iVar9 = tokens->left + -1;
                    tokens->left = iVar9;
                    uVar20 = sVar8 + 10;
                    uVar12 = 0x10;
                    iVar21 = -0x23;
                    iVar11 = 0x10000;
                    puVar22 = VP8Cat5;
LAB_00139302:
                    tokens->tokens[iVar9] = uVar20;
                  }
                }
                else {
                  if ((0 < tokens->left) || (iVar11 = TBufferNewPage(tokens), iVar11 != 0)) {
                    iVar11 = tokens->left;
                    tokens->left = iVar11 + -1;
                    tokens->tokens[(long)iVar11 + -1] = sVar8 + 8U | 0x8000;
                  }
                  uVar12 = (*papVar17)[8];
                  uVar14 = uVar12 + 1 >> 1 & 0x7fff7fff;
                  if (uVar12 < 0xfffe0000) {
                    uVar14 = uVar12;
                  }
                  (*papVar17)[8] = uVar14 + 0x10001;
                  if ((0 < tokens->left) || (iVar11 = TBufferNewPage(tokens), iVar11 != 0)) {
                    iVar9 = tokens->left + -1;
                    tokens->left = iVar9;
                    uVar20 = sVar8 + 10U | 0x8000;
                    uVar12 = 0x400;
                    iVar21 = -0x43;
                    iVar11 = 0x10001;
                    puVar22 = VP8Cat6;
                    goto LAB_00139302;
                  }
                  uVar12 = 0x400;
                  iVar21 = -0x43;
                  iVar11 = 0x10001;
                  puVar22 = VP8Cat6;
                }
                uVar14 = (*papVar17)[9];
                uVar15 = uVar14 + 1 >> 1 & 0x7fff7fff;
                if (uVar14 < 0xfffe0000) {
                  uVar15 = uVar14;
                }
                (*papVar17)[9] = uVar15 + iVar11;
                do {
                  bVar2 = *puVar22;
                  if ((0 < tokens->left) || (iVar11 = TBufferNewPage(tokens), iVar11 != 0)) {
                    iVar11 = tokens->left;
                    tokens->left = iVar11 + -1;
                    uVar13 = 0xc000;
                    if ((uVar12 & iVar21 + (uint)uVar18) == 0) {
                      uVar13 = 0x4000;
                    }
                    tokens->tokens[(long)iVar11 + -1] = bVar2 | uVar13;
                  }
                  puVar22 = puVar22 + 1;
                  bVar7 = 1 < uVar12;
                  uVar12 = uVar12 >> 1;
                } while (bVar7);
                lVar19 = 2;
                iVar21 = 0x16;
              }
            }
          }
          bVar2 = ""[lVar16 + 1];
          paapVar6 = res->stats;
          if ((0 < tokens->left) || (iVar11 = TBufferNewPage(tokens), iVar11 != 0)) {
            iVar11 = tokens->left;
            tokens->left = iVar11 + -1;
            tokens->tokens[(long)iVar11 + -1] = uVar3 & 0x8000 | 0x4080;
          }
          iVar21 = ((uint)bVar2 + iVar10) * 0x21 + iVar21;
          papVar17 = (proba_t (*) [11])
                     ((long)*paapVar6 + lVar19 * 0x2c + (ulong)bVar2 * 0x80 + (ulong)bVar2 * 4);
          uVar12 = 1;
          if (lVar1 != 0x10) {
            if ((0 < tokens->left) || (iVar11 = TBufferNewPage(tokens), iVar11 != 0)) {
              iVar11 = tokens->left;
              tokens->left = iVar11 + -1;
              tokens->tokens[(long)iVar11 + -1] =
                   (ushort)(lVar16 < (long)(ulong)uVar4) << 0xf | (ushort)iVar21;
            }
            uVar12 = (uint)((long)(ulong)uVar4 <= lVar16);
            uVar14 = (*papVar17)[0];
            uVar15 = uVar14 + 1 >> 1 & 0x7fff7fff;
            if (uVar14 < 0xfffe0000) {
              uVar15 = uVar14;
            }
            (*papVar17)[0] = (uVar12 ^ 0x10001) + uVar15;
          }
        }
      } while ((uVar12 == 0) && (lVar16 = lVar1, lVar1 != 0x10));
      iVar9 = 1;
    }
  }
  return iVar9;
}

Assistant:

int VP8RecordCoeffTokens(int ctx, const struct VP8Residual* const res,
                         VP8TBuffer* const tokens) {
  const int16_t* const coeffs = res->coeffs;
  const int coeff_type = res->coeff_type;
  const int last = res->last;
  int n = res->first;
  uint32_t base_id = TOKEN_ID(coeff_type, n, ctx);
  // should be stats[VP8EncBands[n]], but it's equivalent for n=0 or 1
  proba_t* s = res->stats[n][ctx];
  if (!AddToken(tokens, last >= 0, base_id + 0, s + 0)) {
    return 0;
  }

  while (n < 16) {
    const int c = coeffs[n++];
    const int sign = c < 0;
    const uint32_t v = sign ? -c : c;
    if (!AddToken(tokens, v != 0, base_id + 1, s + 1)) {
      base_id = TOKEN_ID(coeff_type, VP8EncBands[n], 0);  // ctx=0
      s = res->stats[VP8EncBands[n]][0];
      continue;
    }
    if (!AddToken(tokens, v > 1, base_id + 2, s + 2)) {
      base_id = TOKEN_ID(coeff_type, VP8EncBands[n], 1);  // ctx=1
      s = res->stats[VP8EncBands[n]][1];
    } else {
      if (!AddToken(tokens, v > 4, base_id + 3, s + 3)) {
        if (AddToken(tokens, v != 2, base_id + 4, s + 4)) {
          AddToken(tokens, v == 4, base_id + 5, s + 5);
        }
      } else if (!AddToken(tokens, v > 10, base_id + 6, s + 6)) {
        if (!AddToken(tokens, v > 6, base_id + 7, s + 7)) {
          AddConstantToken(tokens, v == 6, 159);
        } else {
          AddConstantToken(tokens, v >= 9, 165);
          AddConstantToken(tokens, !(v & 1), 145);
        }
      } else {
        int mask;
        const uint8_t* tab;
        uint32_t residue = v - 3;
        if (residue < (8 << 1)) {          // VP8Cat3  (3b)
          AddToken(tokens, 0, base_id + 8, s + 8);
          AddToken(tokens, 0, base_id + 9, s + 9);
          residue -= (8 << 0);
          mask = 1 << 2;
          tab = VP8Cat3;
        } else if (residue < (8 << 2)) {   // VP8Cat4  (4b)
          AddToken(tokens, 0, base_id + 8, s + 8);
          AddToken(tokens, 1, base_id + 9, s + 9);
          residue -= (8 << 1);
          mask = 1 << 3;
          tab = VP8Cat4;
        } else if (residue < (8 << 3)) {   // VP8Cat5  (5b)
          AddToken(tokens, 1, base_id + 8, s + 8);
          AddToken(tokens, 0, base_id + 10, s + 9);
          residue -= (8 << 2);
          mask = 1 << 4;
          tab = VP8Cat5;
        } else {                         // VP8Cat6 (11b)
          AddToken(tokens, 1, base_id + 8, s + 8);
          AddToken(tokens, 1, base_id + 10, s + 9);
          residue -= (8 << 3);
          mask = 1 << 10;
          tab = VP8Cat6;
        }
        while (mask) {
          AddConstantToken(tokens, !!(residue & mask), *tab++);
          mask >>= 1;
        }
      }
      base_id = TOKEN_ID(coeff_type, VP8EncBands[n], 2);  // ctx=2
      s = res->stats[VP8EncBands[n]][2];
    }
    AddConstantToken(tokens, sign, 128);
    if (n == 16 || !AddToken(tokens, n <= last, base_id + 0, s + 0)) {
      return 1;   // EOB
    }
  }
  return 1;
}